

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O0

Object * __thiscall
Engine::executeLocalFunction(Engine *this,uint functionName,Object **args,uint argc)

{
  LocalFunction *this_00;
  runtime_error *this_01;
  CallArgs *this_02;
  Variable *this_03;
  Object *pOVar1;
  Object *result;
  Variable *variable;
  uint i;
  LocalFunction *localFunction;
  CallArgs *callArgs;
  uint argc_local;
  Object **args_local;
  uint functionName_local;
  Engine *this_local;
  
  if (this->localFunctionsCount <= functionName) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"Engine::executeLocalFunction => out of range!");
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this_02 = (CallArgs *)operator_new(0x38);
  CallArgs::CallArgs(this_02,LOCAL);
  this_00 = this->localFunctions[functionName];
  for (variable._4_4_ = 0; variable._4_4_ < this_00->argsCount; variable._4_4_ = variable._4_4_ + 1)
  {
    this_03 = (Variable *)operator_new(0x10);
    Variable::Variable(this_03,args[variable._4_4_]);
    CallArgs::setVariable(this_02,this_00->args[variable._4_4_],this_03);
  }
  addToCallStack(this,this_02);
  pOVar1 = LocalFunction::execute(this_00,this);
  removeFromCallStack(this);
  if (args != (Object **)0x0) {
    operator_delete__(args);
  }
  return pOVar1;
}

Assistant:

Object* Engine::executeLocalFunction(unsigned int functionName, Object** args, unsigned int argc) {
	if (functionName < 0 || functionName >= this->localFunctionsCount) {
		throw std::runtime_error("Engine::executeLocalFunction => out of range!");
	}
	CallArgs* callArgs = new CallArgs(LOCAL);
	LocalFunction* localFunction = this->localFunctions[functionName];
	unsigned int i;
	for (i = 0; i < localFunction->argsCount; i++) {
		Variable* variable = new Variable(args[i]);
		callArgs->setVariable(localFunction->args[i], variable);
	}
	addToCallStack(callArgs);
	Object* result = localFunction->execute(this);
	removeFromCallStack();
	delete[] args;
	
	return result;
}